

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Options_with_int_data>::siblings_expansion
          (Simplex_tree<Options_with_int_data> *this,Siblings *siblings,int k)

{
  Dictionary_it s_h;
  Dictionary_it next;
  Dictionary_it local_40;
  Dictionary_it local_38;
  
  if ((-1 < k) && (k < this->dimension_)) {
    this->dimension_ = k;
  }
  if (k != 0) {
    local_38.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
          *)(siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    if (local_38.m_ptr ==
        (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
         *)0x0) {
LAB_001087ed:
      __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                    "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>>> *, false>::operator++() [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>>> *, IsConst = false]"
                   );
    }
    if (local_38.m_ptr !=
        (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
         *)((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
           (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
      local_40.m_ptr = local_38.m_ptr;
      do {
        local_38.m_ptr = local_38.m_ptr + 1;
        create_expansion<false>
                  (this,siblings,&local_40,&local_38,&Filtration_simplex_base_dummy::null_,k,
                   (vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_true>_>_>
                    *)0x0);
        if (local_40.m_ptr ==
            (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
             *)0x0) goto LAB_001087ed;
        local_40.m_ptr = local_40.m_ptr + 1;
        if (local_38.m_ptr ==
            (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
             *)0x0) goto LAB_001087ed;
      } while (local_40.m_ptr !=
               (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
                *)((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                  (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size));
    }
  }
  return;
}

Assistant:

void siblings_expansion(Siblings * siblings,  // must contain elements
                          int k) {
    if (k >= 0 && dimension_ > k) {
      dimension_ = k;
    }
    if (k == 0)
      return;
    Dictionary_it next = siblings->members().begin();
    ++next;

    for (Dictionary_it s_h = siblings->members().begin();
         s_h != siblings->members().end(); ++s_h, ++next)
    {
      create_expansion<false>(siblings, s_h, next, s_h->second.filtration(), k);
    }
  }